

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O0

Result __thiscall
wabt::SharedValidator::OnElemSegment
          (SharedValidator *this,Location *loc,Var *table_var,SegmentKind kind)

{
  Type local_80;
  ElemType local_7c;
  Var local_78;
  Enum local_30;
  SegmentKind local_2c;
  Var *pVStack_28;
  SegmentKind kind_local;
  Var *table_var_local;
  Location *loc_local;
  SharedValidator *this_local;
  Result result;
  
  local_2c = kind;
  pVStack_28 = table_var;
  table_var_local = (Var *)loc;
  loc_local = (Location *)this;
  Result::Result((Result *)((long)&this_local + 4),Ok);
  if (local_2c == Active) {
    Var::Var(&local_78,table_var);
    local_30 = (Enum)CheckTableIndex(this,&local_78,(TableType *)0x0);
    Result::operator|=((Result *)((long)&this_local + 4),(Result)local_30);
    Var::~Var(&local_78);
  }
  Type::Type(&local_80,Void);
  ElemType::ElemType(&local_7c,local_80);
  std::vector<wabt::SharedValidator::ElemType,_std::allocator<wabt::SharedValidator::ElemType>_>::
  push_back(&this->elems_,&local_7c);
  return (Result)this_local._4_4_;
}

Assistant:

Result SharedValidator::OnElemSegment(const Location& loc,
                                      Var table_var,
                                      SegmentKind kind) {
  Result result = Result::Ok;
  if (kind == SegmentKind::Active) {
    result |= CheckTableIndex(table_var);
  }
  elems_.push_back(ElemType{Type::Void});  // Updated in OnElemSegmentElemType.
  return result;
}